

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  Curl_cfilter *cf;
  Curl_cfilter *cf_00;
  curl_trc_feat *pcVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  CURLcode CVar6;
  int iVar7;
  timediff_t timeout_ms;
  uint *puVar8;
  int iVar9;
  CURLcode CVar10;
  _Bool done;
  
  if (data->conn == (connectdata *)0x0) {
    return CURLE_OK;
  }
  cf = data->conn->cfilter[sockindex];
  cf_00 = cf;
  while( true ) {
    if (cf_00 == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (cf_00->cft == &Curl_cft_ssl) break;
    cf_00 = cf_00->next;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_cft_ssl.log_level)) {
    Curl_trc_cf_infof(data,cf_00,"shutdown and remove SSL, start");
  }
  CVar6 = CURLE_OK;
  Curl_shutdown_start(data,sockindex,0,(curltime *)0x0);
  if ((cf_00->field_0x24 & 2) == 0) {
    plVar2 = (long *)cf_00->ctx;
    lVar3 = plVar2[9];
    plVar2[9] = (long)data;
    bVar4 = false;
    iVar9 = -10;
    do {
      timeout_ms = Curl_shutdown_timeleft(cf_00->conn,cf_00->sockindex,(curltime *)0x0);
      if (timeout_ms < 0) {
        Curl_failf(data,"SSL shutdown timeout");
        CVar6 = CURLE_OPERATION_TIMEDOUT;
        goto LAB_00173653;
      }
      CVar6 = (**(code **)(*plVar2 + 0x38))(cf_00,data,send_shutdown);
      if (CVar6 != CURLE_OK) {
LAB_0017362e:
        *(long *)((long)cf_00->ctx + 0x48) = lVar3;
        bVar5 = 2;
        goto LAB_0017363d;
      }
      if (*(int *)((long)plVar2 + 0xc4) != 0) {
        iVar7 = Curl_conn_cf_poll(cf_00,data,timeout_ms);
        if (iVar7 < 0) {
          puVar8 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar8);
          CVar6 = CURLE_RECV_ERROR;
        }
        else {
          if (iVar7 != 0) goto LAB_001735ad;
          Curl_failf(data,"SSL shutdown timeout");
          CVar6 = CURLE_OPERATION_TIMEDOUT;
        }
        goto LAB_0017362e;
      }
LAB_001735ad:
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    *(long *)((long)cf_00->ctx + 0x48) = lVar3;
    bVar5 = 0;
    CVar6 = CURLE_OK;
LAB_0017363d:
    cf_00->field_0x24 = cf_00->field_0x24 & 0xfd | bVar5;
  }
  else {
    bVar4 = true;
  }
LAB_00173653:
  Curl_shutdown_clear(data,sockindex);
  CVar10 = CURLE_SSL_SHUTDOWN_FAILED;
  if (bVar4) {
    CVar10 = CURLE_OK;
  }
  if (CVar6 != CURLE_OK) {
    CVar10 = CVar6;
  }
  Curl_conn_cf_discard_sub(cf,cf_00,data,false);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < cf_00->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf_00,"shutdown and remove SSL, done -> %d",(ulong)CVar10);
  }
  return CVar10;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn ? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, 0, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}